

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

attr * findfunc(char *s)

{
  attr *paVar1;
  char *in_RDI;
  string *in_stack_ffffffffffffffc0;
  Env *in_stack_ffffffffffffffc8;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,in_RDI,&local_29);
  paVar1 = Env::findfunc(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return paVar1;
}

Assistant:

struct attr *findfunc(const char *s) {
    return current->findfunc(s);
}